

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint16 * stbi_load_from_file_16(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  FILE *in_RDI;
  stbi__context s;
  stbi__uint16 *result;
  FILE *in_stack_fffffffffffffee8;
  stbi__context *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff1c;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  stbi__context *in_stack_ffffffffffffff38;
  int local_58;
  int local_50;
  stbi__uint16 *local_8;
  
  stbi__start_file(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_8 = stbi__load_and_postprocess_16bit
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
                       ,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  if ((local_8 != (stbi__uint16 *)0x0) &&
     (iVar1 = fseek(in_RDI,(long)-(local_50 - local_58),1), iVar1 == -1)) {
    stbi_image_free((void *)0x1015fe);
    stbi__err("fseek() error");
    local_8 = (stbi__uint16 *)0x0;
  }
  return local_8;
}

Assistant:

STBIDEF stbi__uint16 *stbi_load_from_file_16(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__uint16 *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_16bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      if (fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR) == -1) {
         stbi_image_free(result);
         return (stbi__uint16 *) stbi__errpuc("fseek() error", "File Seek Fail");
      }
   }
   return result;
}